

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::anon_unknown_34::BrokenPipeline::getPipelinedCap
          (BrokenPipeline *this,ArrayPtr<const_capnp::PipelineOp> ops)

{
  ClientHook *extraout_RDX;
  Own<capnp::ClientHook,_std::nullptr_t> OVar1;
  uint *local_48;
  bool local_39;
  Own<capnp::(anonymous_namespace)::BrokenClient,_std::nullptr_t> local_38;
  PipelineOp *local_28;
  BrokenPipeline *this_local;
  ArrayPtr<const_capnp::PipelineOp> ops_local;
  
  this_local = (BrokenPipeline *)ops.size_;
  local_28 = ops.ptr;
  local_39 = false;
  local_48 = &ClientHook::BROKEN_CAPABILITY_BRAND;
  ops_local.size_ = (size_t)this;
  kj::refcounted<capnp::(anonymous_namespace)::BrokenClient,kj::Exception&,bool,unsigned_int_const*>
            ((kj *)&local_38,(Exception *)(local_28 + 3),&local_39,&local_48);
  kj::Own<capnp::ClientHook,decltype(nullptr)>::Own<capnp::(anonymous_namespace)::BrokenClient,void>
            ((Own<capnp::ClientHook,decltype(nullptr)> *)this,&local_38);
  kj::Own<capnp::(anonymous_namespace)::BrokenClient,_std::nullptr_t>::~Own(&local_38);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<ClientHook> BrokenPipeline::getPipelinedCap(kj::ArrayPtr<const PipelineOp> ops) {
  return kj::refcounted<BrokenClient>(exception, false, &ClientHook::BROKEN_CAPABILITY_BRAND);
}